

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * systemWithOutput(string *__return_storage_ptr__,string *command)

{
  int iVar1;
  char *pcVar2;
  runtime_error *prVar3;
  pointer pvVar4;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  int local_d0;
  int status;
  FILE *local_c0;
  FILE *pipe;
  string result;
  array<char,_128UL> buffer;
  string *command_local;
  
  result.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&pipe);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_c0 = popen(pcVar2,"r");
  if (local_c0 == (FILE *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"popen() failed!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (iVar1 = feof(local_c0), iVar1 == 0) {
    pvVar4 = std::array<char,_128UL>::data((array<char,_128UL> *)((long)&result.field_2 + 8));
    pcVar2 = fgets(pvVar4,0x80,local_c0);
    if (pcVar2 != (char *)0x0) {
      pvVar4 = std::array<char,_128UL>::data((array<char,_128UL> *)((long)&result.field_2 + 8));
      std::__cxx11::string::operator+=((string *)&pipe,pvVar4);
    }
  }
  local_d0 = pclose(local_c0);
  if (local_d0 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_130,"[ERROR] Execution of command ",command);
    std::operator+(&local_110,&local_130," exited with ");
    std::__cxx11::to_string(&local_150,local_d0);
    std::operator+(&local_f0,&local_110,&local_150);
    std::runtime_error::runtime_error(prVar3,(string *)&local_f0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pipe);
  std::__cxx11::string::~string((string *)&pipe);
  return __return_storage_ptr__;
}

Assistant:

std::string systemWithOutput(const std::string& command)
{
    std::array<char, 128> buffer{};
    std::string result;

    auto pipe = popen(command.c_str(), "r"); // get rid of shared_ptr

    if (!pipe) throw std::runtime_error("popen() failed!");

    while (!feof(pipe)) {
        if (fgets(buffer.data(), 128, pipe) != nullptr)
            result += buffer.data();
    }

    auto status = pclose(pipe);

    if (status == EXIT_SUCCESS)
        return std::string(result);
    else
        throw std::runtime_error("[ERROR] Execution of command " + command + " exited with " + std::to_string(status));
}